

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void Bpgetrast(char *fn,float *bf,int sx,int sy,int r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  byte *pbVar5;
  uint extraout_EDX;
  long extraout_RDX;
  ulong unaff_RBX;
  char *unaff_RBP;
  byte *pbVar6;
  undefined1 *puVar7;
  uint in_R9D;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *unaff_R13;
  byte *__buf;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  float __x;
  uchar c;
  undefined1 uStack_d5;
  uint uStack_d4;
  ulong uStack_d0;
  long lStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  byte *pbStack_b0;
  long lStack_a8;
  byte *pbStack_a0;
  code *pcStack_98;
  byte bStack_8d;
  uint uStack_8c;
  byte *pbStack_88;
  long lStack_80;
  ulong uStack_78;
  ulong uStack_70;
  byte *pbStack_68;
  float *pfStack_60;
  byte *pbStack_58;
  code *pcStack_50;
  byte local_45;
  uint local_44;
  byte *local_40;
  long local_38;
  
  pbVar5 = (byte *)(ulong)(uint)sy;
  uVar8 = (ulong)(uint)r;
  pbVar6 = (byte *)(ulong)(uint)sy;
  __buf = (byte *)0x0;
  pcStack_50 = (code *)0x102b26;
  uVar3 = r;
  local_44 = sx;
  uVar1 = open(fn,0);
  pbVar13 = pbVar6;
  if (0 < (int)uVar1) {
    unaff_RBP = (char *)(ulong)uVar1;
    if (0 < sy) {
      unaff_RBX = (ulong)local_44;
      local_38 = (long)r << 2;
      unaff_R13 = (byte *)0x0;
      pbVar13 = &local_45;
      pbVar5 = pbVar6;
      local_40 = pbVar6;
      do {
        if (0 < (int)local_44) {
          uVar8 = 0;
          do {
            pcStack_50 = (code *)0x102b6e;
            __buf = pbVar13;
            fn = unaff_RBP;
            sVar4 = read(uVar1,pbVar13,1);
            if (sVar4 != 1) {
              pcStack_50 = (code *)0x102bb7;
              Bpgetrast_cold_2();
              goto LAB_00102bb7;
            }
            bf[uVar8] = (float)local_45;
            uVar8 = uVar8 + 1;
          } while (unaff_RBX != uVar8);
        }
        unaff_R13 = unaff_R13 + 1;
        bf = (float *)((long)bf + local_38);
      } while (unaff_R13 != local_40);
    }
    close(uVar1);
    return;
  }
LAB_00102bb7:
  pcStack_50 = pputrast;
  Bpgetrast_cold_1();
  uVar9 = (ulong)in_R9D;
  pbVar12 = (byte *)(ulong)uVar3;
  uStack_8c = (uint)pbVar5;
  pbVar6 = (byte *)0x180;
  pcStack_98 = (code *)0x102be4;
  uVar1 = uVar3;
  uStack_78 = unaff_RBX;
  uStack_70 = uVar8;
  pbStack_68 = unaff_R13;
  pfStack_60 = bf;
  pbStack_58 = pbVar13;
  pcStack_50 = (code *)unaff_RBP;
  uVar2 = creat(fn,0x180);
  lVar11 = extraout_RDX;
  pbVar13 = pbVar12;
  if ((int)uVar2 < 1) {
LAB_00102c86:
    pcStack_98 = (code *)0x102c8b;
    pputrast_cold_1();
  }
  else {
    unaff_RBP = (char *)(ulong)uVar2;
    fn = (char *)(ulong)uVar2;
    pcStack_98 = (code *)0x102bfd;
    pbVar6 = __buf;
    sVar4 = write(uVar2,__buf,0x20);
    if (sVar4 == 0x20) {
      if (0 < (int)uVar3) {
        unaff_RBX = (ulong)uStack_8c;
        lStack_80 = (long)(int)in_R9D << 2;
        __buf = (byte *)0x0;
        pbVar13 = &bStack_8d;
        pbVar5 = pbVar12;
        pbStack_88 = pbVar12;
        do {
          if (0 < (int)uStack_8c) {
            uVar9 = 0;
            do {
              bStack_8d = (byte)(int)*(float *)(lVar11 + uVar9 * 4);
              pcStack_98 = (code *)0x102c4f;
              pbVar6 = pbVar13;
              fn = unaff_RBP;
              sVar4 = write(uVar2,pbVar13,1);
              if (sVar4 != 1) {
                pcStack_98 = (code *)0x102c86;
                pputrast_cold_3();
                goto LAB_00102c86;
              }
              uVar9 = uVar9 + 1;
            } while (unaff_RBX != uVar9);
          }
          __buf = __buf + 1;
          lVar11 = lVar11 + lStack_80;
        } while (__buf != pbStack_88);
      }
      close(uVar2);
      return;
    }
  }
  pcStack_98 = Bpputrast;
  pputrast_cold_2();
  uVar2 = 0x180;
  uStack_d4 = extraout_EDX;
  uStack_c0 = unaff_RBX;
  uStack_b8 = uVar9;
  pbStack_b0 = __buf;
  lStack_a8 = lVar11;
  pbStack_a0 = pbVar13;
  pcStack_98 = (code *)unaff_RBP;
  uVar3 = creat(fn,0x180);
  if (0 < (int)uVar3) {
    if (0 < (int)pbVar5) {
      uVar8 = (ulong)uStack_d4;
      lStack_c8 = (long)(int)uVar1 << 2;
      uVar9 = 0;
      uStack_d0 = (ulong)pbVar5 & 0xffffffff;
      do {
        if (0 < (int)uStack_d4) {
          uVar10 = 0;
          do {
            uStack_d5 = (undefined1)(int)*(float *)(pbVar6 + uVar10 * 4);
            fn = (char *)(ulong)uVar3;
            puVar7 = &uStack_d5;
            sVar4 = write(uVar3,&uStack_d5,1);
            uVar2 = (uint)puVar7;
            if (sVar4 != 1) {
              Bpputrast_cold_2();
              goto LAB_00102d3e;
            }
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
        }
        uVar9 = uVar9 + 1;
        pbVar6 = pbVar6 + lStack_c8;
      } while (uVar9 != uStack_d0);
    }
    close(uVar3);
    return;
  }
LAB_00102d3e:
  Bpputrast_cold_1();
  __x = 0.0;
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      __x = __x + *(float *)(fn + uVar8 * 4) * *(float *)(fn + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  if (0.0 <= __x) {
    return;
  }
  sqrtf(__x);
  return;
}

Assistant:

void Bpgetrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        if (read(fd,&c,sizeof(c)) != 1) {
          error(4) ;
        }
        bf[r*i + j] = (float)c ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}